

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorTest.cpp
# Opt level: O2

void __thiscall IteratorTest_ConstIterator_Test::TestBody(IteratorTest_ConstIterator_Test *this)

{
  char *message;
  AssertHelper AStack_198;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  local_190;
  AssertionResult gtest_ar;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  local_170;
  pair<Deque<int,_std::allocator<int>_>::DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  p;
  deque<int,_std::allocator<int>_> stdDeque;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  local_e0;
  Deque<int,_std::allocator<int>_> myDeque;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_38;
  
  Deque<int,_std::allocator<int>_>::Deque(&myDeque,(allocator<int> *)&stdDeque);
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            (&stdDeque.super__Deque_base<int,_std::allocator<int>_>);
  for (p.first.n_._0_4_ = 0; (int)p.first.n_ < 100; p.first.n_._0_4_ = (int)p.first.n_ + 1) {
    Deque<int,_std::allocator<int>_>::push_back(&myDeque,(value_type *)&p);
    std::deque<int,_std::allocator<int>_>::push_back(&stdDeque,(value_type *)&p);
  }
  local_170.n_ = 0;
  local_170.deque_ = &myDeque;
  local_e0.n_ = Deque<int,_std::allocator<int>_>::size(&myDeque);
  local_38._M_cur =
       stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
       ._M_cur;
  local_38._M_first =
       stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
       ._M_first;
  local_38._M_last =
       stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
       ._M_last;
  local_38._M_node =
       stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
       ._M_node;
  local_e0.deque_ = &myDeque;
  std::
  mismatch<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,std::_Deque_iterator<int,int_const&,int_const*>>
            (&p,&local_170,&local_e0,&local_38);
  local_190.n_ = Deque<int,_std::allocator<int>_>::size(&myDeque);
  local_190.deque_ = &myDeque;
  testing::internal::
  CmpHelperEQ<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
            ((internal *)&gtest_ar,"p.first","myDeque.cend()",&p.first,&local_190);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_198,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/IteratorTest.cpp"
               ,0x12,message);
    testing::internal::AssertHelper::operator=(&AStack_198,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&AStack_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&stdDeque.super__Deque_base<int,_std::allocator<int>_>);
  Deque<int,_std::allocator<int>_>::~Deque(&myDeque);
  return;
}

Assistant:

TEST(IteratorTest, ConstIterator) {
    Deque<int> myDeque;
    std::deque<int> stdDeque;
    for (int i = 0; i < 100; ++i) {
        myDeque.push_back(i);
        stdDeque.push_back(i);
    }
    auto p = std::mismatch(myDeque.cbegin(), myDeque.cend(), stdDeque.cbegin());
    ASSERT_EQ(p.first, myDeque.cend());
}